

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeImportThrowing(TranslateToFuzzReader *this,Type type)

{
  string_view target;
  uint32_t uVar1;
  Call *pCVar2;
  initializer_list<wasm::Expression_*> __l;
  Const *local_50;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_48;
  allocator_type local_29;
  
  if (type.id == 0) {
    uVar1 = Random::upTo(&this->random,2);
    if (uVar1 == 0) {
      local_50 = Builder::makeConst<int>(&this->builder,0);
    }
    else {
      local_50 = (Const *)makeConst(this,(Type)0x2);
    }
    target = (this->throwImportName).super_IString.str;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_50;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              (&local_48,__l,&local_29);
    pCVar2 = Builder::makeCall(&this->builder,(Name)target,&local_48,(Type)0x0,false);
    if (local_48.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return (Expression *)pCVar2;
  }
  __assert_fail("type == Type::none",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x4d4,"Expression *wasm::TranslateToFuzzReader::makeImportThrowing(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeImportThrowing(Type type) {
  // TODO: This and makeThrow should probably be rare, as they halt the program.

  // We throw from the import, so this call appears to be none and not
  // unreachable.
  assert(type == Type::none);

  // An argument of 0 means to throw a JS exception, and otherwise the value in
  // a wasm tag. Emit 0 or non-zero with ~equal probability.
  Expression* arg;
  if (oneIn(2)) {
    arg = builder.makeConst(int32_t(0));
  } else {
    arg = makeConst(Type::i32);
  }
  return builder.makeCall(throwImportName, {arg}, Type::none);
}